

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

CompileInfo * __thiscall cmGeneratorTarget::GetCompileInfo(cmGeneratorTarget *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  TargetType TVar4;
  string *psVar5;
  iterator iVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo>_>,_bool>
  pVar7;
  string msg;
  CompileInfo info;
  string config_upper;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo>
  local_b0;
  string local_70;
  key_type local_50;
  
  bVar3 = cmTarget::IsImported(this->Target);
  if (!bVar3) {
    TVar4 = cmTarget::GetType(this->Target);
    if ((int)TVar4 < 5) {
      paVar1 = &local_50.field_2;
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_50._M_dataplus._M_p = (pointer)paVar1;
      if (config->_M_string_length != 0) {
        cmsys::SystemTools::UpperCase(&local_b0.first,config);
        std::__cxx11::string::operator=((string *)&local_50,(string *)&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0.first._M_dataplus._M_p != &local_b0.first.field_2) {
          operator_delete(local_b0.first._M_dataplus._M_p,
                          local_b0.first.field_2._M_allocated_capacity + 1);
        }
      }
      iVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo>_>_>
              ::find(&(this->CompileInfoMap)._M_t,&local_50);
      if ((_Rb_tree_header *)iVar6._M_node ==
          &(this->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header) {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        local_70._M_string_length = 0;
        local_70.field_2._M_local_buf[0] = '\0';
        paVar2 = &local_b0.first.field_2;
        local_b0.first._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"COMPILE_PDB","");
        ComputePDBOutputDir(this,&local_b0.first,config,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0.first._M_dataplus._M_p != paVar2) {
          operator_delete(local_b0.first._M_dataplus._M_p,
                          local_b0.first.field_2._M_allocated_capacity + 1);
        }
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmGeneratorTarget::CompileInfo_&,_true>
                  (&local_b0,&local_50,(CompileInfo *)&local_70);
        pVar7 = std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget::CompileInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGeneratorTarget::CompileInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::CompileInfo>>>
                ::
                _M_emplace_unique<std::pair<std::__cxx11::string_const,cmGeneratorTarget::CompileInfo>&>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget::CompileInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGeneratorTarget::CompileInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::CompileInfo>>>
                            *)&this->CompileInfoMap,&local_b0);
        iVar6._M_node = (_Base_ptr)pVar7.first._M_node;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0.second.CompilePdbDir._M_dataplus._M_p !=
            &local_b0.second.CompilePdbDir.field_2) {
          operator_delete(local_b0.second.CompilePdbDir._M_dataplus._M_p,
                          local_b0.second.CompilePdbDir.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0.first._M_dataplus._M_p != paVar2) {
          operator_delete(local_b0.first._M_dataplus._M_p,
                          local_b0.first.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,
                          CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                   local_70.field_2._M_local_buf[0]) + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
      return (CompileInfo *)(iVar6._M_node + 2);
    }
    paVar1 = &local_b0.first.field_2;
    local_b0.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"cmTarget::GetCompileInfo called for ","");
    psVar5 = cmTarget::GetName_abi_cxx11_(this->Target);
    std::__cxx11::string::_M_append((char *)&local_b0,(ulong)(psVar5->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_b0);
    TVar4 = cmTarget::GetType(this->Target);
    cmState::GetTargetTypeName(TVar4);
    std::__cxx11::string::append((char *)&local_b0);
    cmLocalGenerator::IssueMessage(this->LocalGenerator,INTERNAL_ERROR,&local_b0.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0.first._M_dataplus._M_p,
                      local_b0.first.field_2._M_allocated_capacity + 1);
    }
  }
  return (CompileInfo *)0x0;
}

Assistant:

cmGeneratorTarget::CompileInfo const* cmGeneratorTarget::GetCompileInfo(
  const std::string& config) const
{
  // There is no compile information for imported targets.
  if (this->IsImported()) {
    return nullptr;
  }

  if (this->GetType() > cmStateEnums::OBJECT_LIBRARY) {
    std::string msg = "cmTarget::GetCompileInfo called for ";
    msg += this->GetName();
    msg += " which has type ";
    msg += cmState::GetTargetTypeName(this->GetType());
    this->LocalGenerator->IssueMessage(MessageType::INTERNAL_ERROR, msg);
    return nullptr;
  }

  // Lookup/compute/cache the compile information for this configuration.
  std::string config_upper;
  if (!config.empty()) {
    config_upper = cmSystemTools::UpperCase(config);
  }
  CompileInfoMapType::const_iterator i =
    this->CompileInfoMap.find(config_upper);
  if (i == this->CompileInfoMap.end()) {
    CompileInfo info;
    this->ComputePDBOutputDir("COMPILE_PDB", config, info.CompilePdbDir);
    CompileInfoMapType::value_type entry(config_upper, info);
    i = this->CompileInfoMap.insert(entry).first;
  }
  return &i->second;
}